

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall mocker::ir::Branch::~Branch(Branch *this)

{
  ~Branch((Branch *)&this[-1].else_);
  return;
}

Assistant:

Branch(std::shared_ptr<Addr> condition, std::shared_ptr<Label> then,
         std::shared_ptr<Label> else_)
      : IRInst(InstType::Branch), condition(std::move(condition)),
        then(std::move(then)), else_(std::move(else_)) {}